

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_4.cpp
# Opt level: O0

char * strdup(char *__s)

{
  size_t sVar1;
  char *pcVar2;
  ulong local_28;
  size_t i;
  char *ss;
  size_t length;
  char *s_local;
  
  sVar1 = strlen(__s);
  pcVar2 = (char *)operator_new__(sVar1 + 1);
  for (local_28 = 0; local_28 < sVar1; local_28 = local_28 + 1) {
    pcVar2[local_28] = __s[local_28];
  }
  pcVar2[sVar1] = '\0';
  return pcVar2;
}

Assistant:

char* strdup(const char* s)
{
	size_t length = strlen(s);
	char* ss = new char[length + 1];
	for (size_t i = 0; i < length; ++i)
		ss[i] = s[i];
	ss[length] = '\0';
	return ss;
}